

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

int __thiscall google::protobuf::internal::ExtensionSet::NumExtensions(ExtensionSet *this)

{
  ExtensionSet *unaff_retaddr;
  anon_class_8_1_6971b95b in_stack_00000008;
  int result;
  
  ForEach<google::protobuf::internal::ExtensionSet::NumExtensions()const::__0>
            (unaff_retaddr,in_stack_00000008);
  return 0;
}

Assistant:

int ExtensionSet::NumExtensions() const {
  int result = 0;
  ForEach([&result](int /* number */, const Extension& ext) {
    if (!ext.is_cleared) {
      ++result;
    }
  });
  return result;
}